

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall kj::Own<kj::AppendableFile>::dispose(Own<kj::AppendableFile> *this)

{
  AppendableFile *this_00;
  Disposer *in_RDX;
  
  this_00 = this->ptr;
  if (this_00 != (AppendableFile *)0x0) {
    this->ptr = (AppendableFile *)0x0;
    Disposer::Dispose_<kj::AppendableFile,_true>::dispose
              ((Dispose_<kj::AppendableFile,_true> *)this_00,(AppendableFile *)this->disposer,in_RDX
              );
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }